

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimClassesRefine(Cec_ManSim_t *p)

{
  int iVar1;
  Cec_ParSim_t *pCVar2;
  int iVar3;
  
  Gia_ManCreateValueRefs(p->pAig);
  pCVar2 = p->pPars;
  p->nWords = pCVar2->nWords;
  iVar1 = pCVar2->nRounds;
  if (0 < iVar1) {
    iVar3 = 0;
    do {
      if ((iVar3 % (iVar1 / 5) == 0) && (pCVar2->fVerbose != 0)) {
        Gia_ManEquivPrintClasses
                  (p->pAig,0,(float)(pCVar2->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
      }
      Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
      iVar1 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar1 != 0) {
        return 1;
      }
      iVar3 = iVar3 + 1;
      pCVar2 = p->pPars;
      iVar1 = pCVar2->nRounds;
    } while (iVar3 < iVar1);
  }
  if (pCVar2->fVerbose != 0) {
    Gia_ManEquivPrintClasses
              (p->pAig,0,(float)(pCVar2->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
  }
  return 0;
}

Assistant:

int Cec_ManSimClassesRefine( Cec_ManSim_t * p )
{
    int i;
    Gia_ManCreateValueRefs( p->pAig );
    p->nWords = p->pPars->nWords;
    for ( i = 0; i < p->pPars->nRounds; i++ )
    {
        if ( (i % (p->pPars->nRounds / 5)) == 0 && p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    if ( p->pPars->fVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    return 0;
}